

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# out.c
# Opt level: O0

LY_ERR ly_write_(ly_out *out,char *buf,size_t len)

{
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  int *piVar4;
  ssize_t r_1;
  ssize_t r;
  size_t new_mem_size;
  size_t written;
  LY_ERR ret;
  size_t len_local;
  char *buf_local;
  ly_out *out_local;
  
  new_mem_size = 0;
  if (out->hole_count == 0) {
    do {
      written._4_4_ = LY_SUCCESS;
      sVar3 = new_mem_size;
      switch(out->type) {
      case LY_OUT_FD:
        sVar3 = write((out->method).fd,buf,len);
        if ((long)sVar3 < 0) {
          written._4_4_ = LY_ESYS;
          sVar3 = new_mem_size;
        }
        break;
      case LY_OUT_FDSTREAM:
      case LY_OUT_FILE:
      case LY_OUT_FILEPATH:
        sVar3 = fwrite(buf,1,len,(FILE *)(out->method).f);
        if (sVar3 != len) {
          written._4_4_ = LY_ESYS;
        }
        break;
      case LY_OUT_MEMORY:
        pcVar1 = (out->method).fpath.filepath + len + 1;
        if ((char *)(out->method).mem.size < pcVar1) {
          pcVar2 = (char *)ly_realloc(*(out->method).mem.buf,
                                      (size_t)(pcVar1 + (0x400 - ((ulong)pcVar1 & 0x3ff))));
          *(out->method).mem.buf = pcVar2;
          if (*(out->method).mem.buf == (char *)0x0) {
            (out->method).fpath.filepath = (char *)0x0;
            (out->method).mem.size = 0;
            ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_write_");
            return LY_EMEM;
          }
          (out->method).mem.size = (size_t)(pcVar1 + (0x400 - ((ulong)pcVar1 & 0x3ff)));
        }
        if (len != 0) {
          memcpy(*(out->method).mem.buf + (long)(out->method).fpath.filepath,buf,len);
        }
        (out->method).fpath.filepath = (out->method).fpath.filepath + len;
        (*(out->method).mem.buf)[(long)(out->method).fpath.filepath] = '\0';
        sVar3 = len;
        break;
      case LY_OUT_CALLBACK:
        sVar3 = (*(out->method).clb.func)((out->method).fpath.filepath,buf,len);
        if ((long)sVar3 < 0) {
          written._4_4_ = LY_ESYS;
          sVar3 = new_mem_size;
        }
        break;
      case LY_OUT_ERROR:
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/out.c",0x282)
        ;
        return LY_EINT;
      }
      new_mem_size = sVar3;
      if (written._4_4_ == LY_SUCCESS) {
        if (new_mem_size == len) {
          if (out->type == LY_OUT_FDSTREAM) {
            lseek((out->method).fdstream.fd,0,2);
          }
          written._4_4_ = LY_SUCCESS;
        }
        else {
          ly_log((ly_ctx *)0x0,LY_LLERR,LY_ESYS,
                 "%s: writing data failed (unable to write %u from %u data).","ly_write_",
                 (ulong)(uint)((int)len - (int)new_mem_size),(int)len);
          written._4_4_ = LY_ESYS;
        }
        goto LAB_0015811a;
      }
      piVar4 = __errno_location();
    } while ((*piVar4 == 0xb) || (piVar4 = __errno_location(), *piVar4 == 0xb));
    piVar4 = __errno_location();
    pcVar1 = strerror(*piVar4);
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_ESYS,"%s: writing data failed (%s).","ly_write_",pcVar1);
    new_mem_size = 0;
LAB_0015811a:
    out->printed = new_mem_size + out->printed;
    out->func_printed = new_mem_size + out->func_printed;
    out_local._4_4_ = written._4_4_;
  }
  else {
    if (out->buf_size < out->buf_len + len) {
      pcVar1 = (char *)ly_realloc(out->buffered,out->buf_len + len);
      out->buffered = pcVar1;
      if (out->buffered == (char *)0x0) {
        out->buf_len = 0;
        out->buf_size = 0;
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_write_");
        return LY_EMEM;
      }
      out->buf_size = out->buf_len + len;
    }
    if (len != 0) {
      memcpy(out->buffered + out->buf_len,buf,len);
    }
    out->buf_len = len + out->buf_len;
    out->printed = len + out->printed;
    out->func_printed = len + out->func_printed;
    out_local._4_4_ = LY_SUCCESS;
  }
  return out_local._4_4_;
}

Assistant:

LY_ERR
ly_write_(struct ly_out *out, const char *buf, size_t len)
{
    LY_ERR ret = LY_SUCCESS;
    size_t written = 0, new_mem_size;

    if (out->hole_count) {
        /* we are buffering data after a hole */
        if (out->buf_len + len > out->buf_size) {
            out->buffered = ly_realloc(out->buffered, out->buf_len + len);
            if (!out->buffered) {
                out->buf_len = 0;
                out->buf_size = 0;
                LOGMEM(NULL);
                return LY_EMEM;
            }
            out->buf_size = out->buf_len + len;
        }

        if (len) {
            memcpy(&out->buffered[out->buf_len], buf, len);
        }
        out->buf_len += len;

        out->printed += len;
        out->func_printed += len;
        return LY_SUCCESS;
    }

repeat:
    switch (out->type) {
    case LY_OUT_MEMORY:
        new_mem_size = out->method.mem.len + len + 1;
        if (new_mem_size > out->method.mem.size) {
            new_mem_size = REALLOC_CHUNK(new_mem_size);
            *out->method.mem.buf = ly_realloc(*out->method.mem.buf, new_mem_size);
            if (!*out->method.mem.buf) {
                out->method.mem.len = 0;
                out->method.mem.size = 0;
                LOGMEM(NULL);
                return LY_EMEM;
            }
            out->method.mem.size = new_mem_size;
        }
        if (len) {
            memcpy(&(*out->method.mem.buf)[out->method.mem.len], buf, len);
        }
        out->method.mem.len += len;
        (*out->method.mem.buf)[out->method.mem.len] = '\0';

        written = len;
        break;
    case LY_OUT_FD: {
        ssize_t r;

        r = write(out->method.fd, buf, len);
        if (r < 0) {
            ret = LY_ESYS;
        } else {
            written = (size_t)r;
        }
        break;
    }
    case LY_OUT_FDSTREAM:
    case LY_OUT_FILEPATH:
    case LY_OUT_FILE:
        written = fwrite(buf, sizeof *buf, len, out->method.f);
        if (written != len) {
            ret = LY_ESYS;
        }
        break;
    case LY_OUT_CALLBACK: {
        ssize_t r;

        r = out->method.clb.func(out->method.clb.arg, buf, len);
        if (r < 0) {
            ret = LY_ESYS;
        } else {
            written = (size_t)r;
        }
        break;
    }
    case LY_OUT_ERROR:
        LOGINT(NULL);
        return LY_EINT;
    }

    if (ret) {
        if ((errno == EAGAIN) || (errno == EWOULDBLOCK)) {
            ret = LY_SUCCESS;
            goto repeat;
        }
        LOGERR(NULL, LY_ESYS, "%s: writing data failed (%s).", __func__, strerror(errno));
        written = 0;
    } else if (written != len) {
        LOGERR(NULL, LY_ESYS, "%s: writing data failed (unable to write %" PRIu32 " from %" PRIu32 " data).", __func__,
                (uint32_t)(len - written), (uint32_t)len);
        ret = LY_ESYS;
    } else {
        if (out->type == LY_OUT_FDSTREAM) {
            /* move the original file descriptor to the end of the output file */
            lseek(out->method.fdstream.fd, 0, SEEK_END);
        }
        ret = LY_SUCCESS;
    }

    out->printed += written;
    out->func_printed += written;
    return ret;
}